

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_decoder.cpp
# Opt level: O1

int __thiscall zmq::v1_decoder_t::one_byte_size_ready(v1_decoder_t *this,uchar *param_1)

{
  msg_t *this_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  v1_decoder_t *this_01;
  EVP_PKEY_CTX *ctx;
  
  bVar1 = this->_tmpbuf[0];
  if (bVar1 == 0) {
    piVar5 = __errno_location();
    *piVar5 = 0x47;
LAB_001fe83a:
    iVar3 = -1;
  }
  else {
    if (bVar1 == 0xff) {
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._read_pos =
           this->_tmpbuf;
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._to_read = 8;
      (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._next =
           (step_t)eight_byte_size_ready;
      *(undefined8 *)
       &(this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>).field_0x10 = 0;
    }
    else {
      if (this->_max_msg_size < (long)((ulong)bVar1 - 1) && -1 < this->_max_msg_size) {
        piVar5 = __errno_location();
        *piVar5 = 0x5a;
        goto LAB_001fe83a;
      }
      this_00 = &this->_in_progress;
      msg_t::close(this_00,(int)param_1);
      ctx = (EVP_PKEY_CTX *)((ulong)this->_tmpbuf[0] - 1);
      iVar3 = msg_t::init_size(this_00,(size_t)ctx);
      if (iVar3 == 0) {
        (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._read_pos =
             this->_tmpbuf;
        (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._to_read = 1;
        (this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>)._next =
             (step_t)flags_ready;
        *(undefined8 *)
         &(this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>).field_0x10 = 0;
      }
      else {
        this_01 = (v1_decoder_t *)__errno_location();
        uVar2 = *(uint *)&(this_01->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>
                          ).super_i_decoder._vptr_i_decoder;
        if (uVar2 != 0xc) {
          one_byte_size_ready((v1_decoder_t *)(ulong)uVar2);
        }
        iVar4 = msg_t::init(this_00,ctx);
        if (iVar4 != 0) {
          one_byte_size_ready(this_01);
        }
        *(undefined4 *)
         &(this_01->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>).
          super_i_decoder._vptr_i_decoder = 0xc;
      }
      if (iVar3 != 0) {
        return -1;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int zmq::v1_decoder_t::one_byte_size_ready (unsigned char const *)
{
    //  First byte of size is read. If it is UCHAR_MAX (0xff) read 8-byte size.
    //  Otherwise allocate the buffer for message data and read the
    //  message data into it.
    if (*_tmpbuf == UCHAR_MAX)
        next_step (_tmpbuf, 8, &v1_decoder_t::eight_byte_size_ready);
    else {
        //  There has to be at least one byte (the flags) in the message).
        if (!*_tmpbuf) {
            errno = EPROTO;
            return -1;
        }

        if (_max_msg_size >= 0
            && static_cast<int64_t> (*_tmpbuf - 1) > _max_msg_size) {
            errno = EMSGSIZE;
            return -1;
        }

        int rc = _in_progress.close ();
        assert (rc == 0);
        rc = _in_progress.init_size (*_tmpbuf - 1);
        if (rc != 0) {
            errno_assert (errno == ENOMEM);
            rc = _in_progress.init ();
            errno_assert (rc == 0);
            errno = ENOMEM;
            return -1;
        }

        next_step (_tmpbuf, 1, &v1_decoder_t::flags_ready);
    }
    return 0;
}